

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  unsigned_long_long uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char_t *s;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    bVar2 = value[lVar6];
    lVar7 = lVar6 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
  uVar8 = (ulong)((bVar2 - 0x2b & 0xfd) == 0);
  if ((value[lVar6 + uVar8] == '0') && ((value[lVar7 + uVar8] & 0xdfU) == 0x58)) {
    pcVar11 = value + lVar7 + uVar8;
    do {
      pcVar12 = pcVar11 + 1;
      pcVar11 = pcVar11 + 1;
    } while (*pcVar12 == '0');
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar10 = (int)*pcVar11 - 0x30;
      if (uVar10 < 10) {
        uVar8 = uVar8 << 4 | (ulong)uVar10;
      }
      else {
        uVar10 = (int)*pcVar11 | 0x20;
        if (5 < uVar10 - 0x61) goto LAB_0013544f;
        uVar8 = uVar8 * 0x10 + (ulong)(uVar10 - 0x57);
      }
      pcVar11 = pcVar11 + 1;
      uVar9 = uVar9 + 1;
    } while( true );
  }
  pcVar11 = (char *)(uVar8 + lVar7);
  do {
    pcVar12 = pcVar11;
    cVar3 = value[(long)(pcVar12 + -1)];
    pcVar11 = pcVar12 + 1;
  } while (cVar3 == '0');
  pcVar12 = value + (long)(pcVar12 + -1);
  uVar8 = 0;
  cVar4 = *pcVar12;
  while ((int)cVar4 - 0x30U < 10) {
    uVar8 = (ulong)((int)cVar4 - 0x30U) + uVar8 * 10;
    pcVar1 = pcVar12 + 1;
    pcVar12 = pcVar12 + 1;
    cVar4 = *pcVar1;
  }
  if ((char *)0x13 < pcVar12 + (-(long)pcVar11 - (long)value) + 2) {
    bVar13 = true;
    if (pcVar12 + (-0x12 - (long)value) != pcVar11) goto LAB_00135467;
    if ('0' < cVar3) {
      bVar13 = -1 < (long)uVar8 || cVar3 != '1';
      goto LAB_00135467;
    }
  }
  bVar13 = false;
LAB_00135467:
  if (bVar2 != 0x2d) {
    if (maxv <= uVar8) {
      uVar8 = maxv;
    }
    if (bVar13) {
      uVar8 = maxv;
    }
    return uVar8;
  }
  uVar5 = -uVar8;
  if (-minv < uVar8) {
    uVar5 = minv;
  }
  if (bVar13) {
    uVar5 = minv;
  }
  return uVar5;
LAB_0013544f:
  bVar13 = 0x10 < uVar9;
  goto LAB_00135467;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}